

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindExtensionByName(Descriptor *this,string_view name)

{
  SymbolT SVar1;
  SymbolT SVar2;
  
  SVar1 = FileDescriptorTables::
          FindNestedSymbol<google::protobuf::(anonymous_namespace)::ParentNameQuery>
                    (this->file_->tables_,this,name);
  if ((SVar1.ptr_)->symbol_type_ == '\x02') {
    SVar2.ptr_ = &((FieldDescriptor *)0x0)->super_SymbolBase;
    if ((SVar1.ptr_[1].symbol_type_ & 8) != 0) {
      SVar2 = SVar1;
    }
  }
  else {
    SVar2.ptr_ = &((FieldDescriptor *)0x0)->super_SymbolBase;
  }
  return (FieldDescriptor *)SVar2.ptr_;
}

Assistant:

const FieldDescriptor* Descriptor::FindExtensionByName(
    absl::string_view name) const {
  const FieldDescriptor* field =
      file()->tables_->FindNestedSymbol(this, name).field_descriptor();
  return field != nullptr && field->is_extension() ? field : nullptr;
}